

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  allocator local_21;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,0x194d33);
  std::__cxx11::string::find_last_not_of((char *)str,0x194d33);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : "";
    }